

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O3

string * __thiscall
CLI::Timer::make_time_str_abi_cxx11_(string *__return_storage_ptr__,Timer *this,double time)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_class_1_0_00000001 print_it;
  anon_class_1_0_00000001 local_a1;
  double local_a0;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_a0 = time;
  if (1e-06 <= time) {
    if (0.001 <= time) {
      if (1.0 <= time) {
        paVar2 = &local_98.field_2;
        local_98._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"s","");
        make_time_str::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr__,&local_a1,local_a0,&local_98);
        _Var1._M_p = local_98._M_dataplus._M_p;
      }
      else {
        paVar2 = &local_78.field_2;
        local_78._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ms","");
        make_time_str::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr__,&local_a1,local_a0 * 1000.0,&local_78);
        _Var1._M_p = local_78._M_dataplus._M_p;
      }
    }
    else {
      paVar2 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"us","");
      make_time_str::anon_class_1_0_00000001::operator()
                (__return_storage_ptr__,&local_a1,local_a0 * 1000000.0,&local_58);
      _Var1._M_p = local_58._M_dataplus._M_p;
    }
  }
  else {
    paVar2 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ns","");
    make_time_str::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,&local_a1,local_a0 * 1000000000.0,&local_38);
    _Var1._M_p = local_38._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_time_str(double time) const {
        auto print_it = [](double x, std::string unit) {
            char buffer[50];
            std::snprintf(buffer, 50, "%.5g", x);
            return buffer + std::string(" ") + unit;
        };

        if(time < .000001)
            return print_it(time * 1000000000, "ns");
        else if(time < .001)
            return print_it(time * 1000000, "us");
        else if(time < 1)
            return print_it(time * 1000, "ms");
        else
            return print_it(time, "s");
    }